

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O2

void __thiscall
wasm::TypeUpdater::noteAddition
          (TypeUpdater *this,Expression *curr,Expression *parent,Expression *previous)

{
  iterator iVar1;
  Expression *local_28;
  Expression *curr_local;
  
  local_28 = curr;
  iVar1 = std::
          _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::_Select1st<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
          ::find(&(this->parents)._M_t,&local_28);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->parents)._M_t._M_impl.super__Rb_tree_header) {
    noteRemovalOrAddition(this,local_28,parent);
    if ((previous == (Expression *)0x0) || ((previous->type).id != (local_28->type).id)) {
      propagateTypesUp(this,local_28);
    }
    return;
  }
  __assert_fail("parents.find(curr) == parents.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.h"
                ,0x96,
                "void wasm::TypeUpdater::noteAddition(Expression *, Expression *, Expression *)");
}

Assistant:

void noteAddition(Expression* curr,
                    Expression* parent,
                    Expression* previous = nullptr) {
    assert(parents.find(curr) == parents.end()); // must not already exist
    noteRemovalOrAddition(curr, parent);
    // if we didn't replace with the exact same type, propagate types up
    if (!(previous && previous->type == curr->type)) {
      propagateTypesUp(curr);
    }
  }